

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

void Abc_SclUpsizeRemoveDangling(SC_Man *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  SC_Cell *pSVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  SC_Cell *pCell;
  Abc_Ntk_t *pNtk_local;
  SC_Man *p_local;
  
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_2c);
    if ((((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
        (iVar1 = Abc_ObjIsBarBuf(pObj_00), iVar1 == 0)) &&
       (iVar1 = Abc_ObjFanoutNum(pObj_00), iVar1 == 0)) {
      pSVar2 = Abc_SclObjCell(pObj_00);
      p->SumArea = p->SumArea - pSVar2->area;
      Abc_NtkDeleteObj_rec(pObj_00,1);
    }
  }
  return;
}

Assistant:

void Abc_SclUpsizeRemoveDangling( SC_Man * p, Abc_Ntk_t * pNtk )
{
    SC_Cell * pCell;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) == 0 )
        {
            pCell = Abc_SclObjCell( pObj );
            p->SumArea -= pCell->area;
            Abc_NtkDeleteObj_rec( pObj, 1 );
//            printf( "Removed node %d.\n", i );
        }
}